

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb.cc
# Opt level: O1

char * CB::bufcache_label(label *ld,char *c)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  char *pcVar3;
  long lVar4;
  cb_class *pcVar5;
  ulong uVar6;
  
  *(long *)c = (long)(ld->costs)._end - (long)(ld->costs)._begin >> 4;
  pcVar3 = c + 8;
  pcVar5 = (ld->costs)._begin;
  if ((ld->costs)._end != pcVar5) {
    lVar4 = 0;
    uVar6 = 0;
    do {
      puVar1 = (undefined8 *)((long)&pcVar5->cost + lVar4);
      uVar2 = puVar1[1];
      *(undefined8 *)(pcVar3 + lVar4) = *puVar1;
      *(undefined8 *)(pcVar3 + lVar4 + 8) = uVar2;
      uVar6 = uVar6 + 1;
      pcVar5 = (ld->costs)._begin;
      lVar4 = lVar4 + 0x10;
    } while (uVar6 < (ulong)((long)(ld->costs)._end - (long)pcVar5 >> 4));
    pcVar3 = pcVar3 + lVar4;
  }
  return pcVar3;
}

Assistant:

char* bufcache_label(CB::label* ld, char* c)
{
  *(size_t*)c = ld->costs.size();
  c += sizeof(size_t);
  for (size_t i = 0; i < ld->costs.size(); i++)
  {
    *(cb_class*)c = ld->costs[i];
    c += sizeof(cb_class);
  }
  return c;
}